

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list.c
# Opt level: O2

REF_STATUS ref_list_deep_copy(REF_LIST *ref_list_ptr,REF_LIST original)

{
  uint uVar1;
  int iVar2;
  REF_LIST pRVar3;
  REF_INT *pRVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  undefined8 uStack_20;
  
  pRVar3 = (REF_LIST)malloc(0x10);
  *ref_list_ptr = pRVar3;
  if (pRVar3 == (REF_LIST)0x0) {
    pcVar6 = "malloc *ref_list_ptr of REF_LIST_STRUCT NULL";
    uStack_20 = 0x36;
  }
  else {
    uVar1 = original->n;
    pRVar3->n = uVar1;
    iVar2 = original->max;
    pRVar3->max = iVar2;
    if ((long)iVar2 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list.c",0x3c,
             "ref_list_deep_copy","malloc ref_list->value of REF_INT negative");
      return 1;
    }
    pRVar4 = (REF_INT *)malloc((long)iVar2 << 2);
    pRVar3->value = pRVar4;
    if (pRVar4 != (REF_INT *)0x0) {
      uVar7 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar7 = 0;
      }
      for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        pRVar4[uVar5] = original->value[uVar5];
      }
      return 0;
    }
    pcVar6 = "malloc ref_list->value of REF_INT NULL";
    uStack_20 = 0x3c;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list.c",uStack_20,
         "ref_list_deep_copy",pcVar6);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_list_deep_copy(REF_LIST *ref_list_ptr,
                                      REF_LIST original) {
  REF_LIST ref_list;
  REF_INT i;

  ref_malloc(*ref_list_ptr, 1, REF_LIST_STRUCT);
  ref_list = (*ref_list_ptr);

  ref_list_n(ref_list) = ref_list_n(original);
  ref_list_max(ref_list) = ref_list_max(original);

  ref_malloc(ref_list->value, ref_list_max(ref_list), REF_INT);
  for (i = 0; i < ref_list_n(ref_list); i++)
    ref_list->value[i] = original->value[i];

  return REF_SUCCESS;
}